

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cpp
# Opt level: O2

unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>
 __thiscall anon_unknown.dwarf_221797::PKDescriptor::Clone(PKDescriptor *this)

{
  const_reference pvVar1;
  PKDescriptor *this_00;
  pointer *__ptr;
  size_type in_RSI;
  pointer __p;
  long in_FS_OFFSET;
  PubkeyProvider *local_38;
  _Head_base<0UL,_(anonymous_namespace)::PKDescriptor_*,_false> local_30;
  _Head_base<0UL,_(anonymous_namespace)::PubkeyProvider_*,_false> local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  pvVar1 = std::
           vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
           ::at((vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
                 *)(in_RSI + 8),in_RSI);
  (*((pvVar1->_M_t).
     super___uniq_ptr_impl<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>
     ._M_t.
     super__Tuple_impl<0UL,_(anonymous_namespace)::PubkeyProvider_*,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>
     .super__Head_base<0UL,_(anonymous_namespace)::PubkeyProvider_*,_false>._M_head_impl)->
    _vptr_PubkeyProvider[0xb])(&local_38);
  this_00 = (PKDescriptor *)operator_new(0x60);
  local_28._M_head_impl = local_38;
  local_38 = (PubkeyProvider *)0x0;
  PKDescriptor(this_00,(unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>
                        *)&local_28,*(bool *)(in_RSI + 0x58));
  if (local_28._M_head_impl != (PubkeyProvider *)0x0) {
    (*(local_28._M_head_impl)->_vptr_PubkeyProvider[1])();
  }
  local_30._M_head_impl = (PKDescriptor *)0x0;
  (this->super_DescriptorImpl).super_Descriptor._vptr_Descriptor = (_func_int **)this_00;
  std::
  unique_ptr<(anonymous_namespace)::PKDescriptor,_std::default_delete<(anonymous_namespace)::PKDescriptor>_>
  ::~unique_ptr((unique_ptr<(anonymous_namespace)::PKDescriptor,_std::default_delete<(anonymous_namespace)::PKDescriptor>_>
                 *)&local_30);
  if (local_38 != (PubkeyProvider *)0x0) {
    (*local_38->_vptr_PubkeyProvider[1])();
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return (__uniq_ptr_data<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>,_true,_true>
            )(__uniq_ptr_data<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>,_true,_true>
              )this;
  }
  __stack_chk_fail();
}

Assistant:

std::unique_ptr<DescriptorImpl> Clone() const override
    {
        return std::make_unique<PKDescriptor>(m_pubkey_args.at(0)->Clone(), m_xonly);
    }